

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeParseCellPtr(MemPage *pPage,u8 *pCell,CellInfo *pInfo)

{
  ulong uVar1;
  byte *pbVar2;
  bool local_42;
  u8 x;
  u8 *pEnd;
  u64 iKey;
  byte *pbStack_28;
  u32 nPayload;
  u8 *pIter;
  CellInfo *pInfo_local;
  u8 *pCell_local;
  MemPage *pPage_local;
  
  iKey._4_4_ = (uint)*pCell;
  pbStack_28 = pCell;
  if (0x7f < iKey._4_4_) {
    iKey._4_4_ = iKey._4_4_ & 0x7f;
    pbStack_28 = pCell;
    do {
      pbVar2 = pbStack_28 + 1;
      iKey._4_4_ = iKey._4_4_ << 7 | pbStack_28[1] & 0x7f;
      local_42 = 0x7f < *pbVar2 && pbVar2 < pCell + 8;
      pbStack_28 = pbVar2;
    } while (local_42);
  }
  pEnd = (u8 *)(ulong)pbStack_28[1];
  pbVar2 = pbStack_28 + 1;
  if ((u8 *)0x7f < pEnd) {
    uVar1 = (long)pEnd << 7 ^ (ulong)pbStack_28[2];
    if (pbStack_28[2] < 0x80) {
      pEnd = (u8 *)(uVar1 ^ 0x4000);
      pbVar2 = pbStack_28 + 2;
    }
    else {
      uVar1 = uVar1 << 7 ^ (ulong)pbStack_28[3];
      if (pbStack_28[3] < 0x80) {
        pEnd = (u8 *)(uVar1 ^ 0x204000);
        pbVar2 = pbStack_28 + 3;
      }
      else {
        pEnd = (u8 *)(uVar1 << 7 ^ 0x10204000 ^ (ulong)pbStack_28[4]);
        pbVar2 = pbStack_28 + 4;
        if (0x7f < pbStack_28[4]) {
          pEnd = (u8 *)((long)pEnd << 7 ^ 0x4000U ^ (ulong)pbStack_28[5]);
          pbVar2 = pbStack_28 + 5;
          if (0x7f < pbStack_28[5]) {
            pEnd = (u8 *)((long)pEnd << 7 ^ 0x4000U ^ (ulong)pbStack_28[6]);
            pbVar2 = pbStack_28 + 6;
            if (0x7f < pbStack_28[6]) {
              pEnd = (u8 *)((long)pEnd << 7 ^ 0x4000U ^ (ulong)pbStack_28[7]);
              pbVar2 = pbStack_28 + 7;
              if (0x7f < pbStack_28[7]) {
                pEnd = (u8 *)((long)pEnd << 7 ^ 0x4000U ^ (ulong)pbStack_28[8]);
                pbVar2 = pbStack_28 + 8;
                if (0x7f < pbStack_28[8]) {
                  pEnd = (u8 *)((long)pEnd << 8 ^ 0x8000U ^ (ulong)pbStack_28[9]);
                  pbVar2 = pbStack_28 + 9;
                }
              }
            }
          }
        }
      }
    }
  }
  pbStack_28 = pbVar2;
  pInfo->nKey = (i64)pEnd;
  pInfo->nPayload = iKey._4_4_;
  pInfo->pPayload = pbStack_28 + 1;
  if (pPage->maxLocal < iKey._4_4_) {
    btreeParseCellAdjustSizeForOverflow(pPage,pCell,pInfo);
  }
  else {
    pInfo->nSize = (u16)iKey._4_4_ + ((short)(pbStack_28 + 1) - (short)pCell);
    if (pInfo->nSize < 4) {
      pInfo->nSize = 4;
    }
    pInfo->nLocal = (u16)iKey._4_4_;
  }
  return;
}

Assistant:

static void btreeParseCellPtr(
  MemPage *pPage,         /* Page containing the cell */
  u8 *pCell,              /* Pointer to the cell text. */
  CellInfo *pInfo         /* Fill in this structure */
){
  u8 *pIter;              /* For scanning through pCell */
  u32 nPayload;           /* Number of bytes of cell payload */
  u64 iKey;               /* Extracted Key value */

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->leaf==0 || pPage->leaf==1 );
  assert( pPage->intKeyLeaf );
  assert( pPage->childPtrSize==0 );
  pIter = pCell;

  /* The next block of code is equivalent to:
  **
  **     pIter += getVarint32(pIter, nPayload);
  **
  ** The code is inlined to avoid a function call.
  */
  nPayload = *pIter;
  if( nPayload>=0x80 ){
    u8 *pEnd = &pIter[8];
    nPayload &= 0x7f;
    do{
      nPayload = (nPayload<<7) | (*++pIter & 0x7f);
    }while( (*pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;

  /* The next block of code is equivalent to:
  **
  **     pIter += getVarint(pIter, (u64*)&pInfo->nKey);
  **
  ** The code is inlined and the loop is unrolled for performance.
  ** This routine is a high-runner.
  */
  iKey = *pIter;
  if( iKey>=0x80 ){
    u8 x;
    iKey = (iKey<<7) ^ (x = *++pIter);
    if( x>=0x80 ){
      iKey = (iKey<<7) ^ (x = *++pIter);
      if( x>=0x80 ){
        iKey = (iKey<<7) ^ 0x10204000 ^ (x = *++pIter);
        if( x>=0x80 ){
          iKey = (iKey<<7) ^ 0x4000 ^ (x = *++pIter);
          if( x>=0x80 ){
            iKey = (iKey<<7) ^ 0x4000 ^ (x = *++pIter);
            if( x>=0x80 ){
              iKey = (iKey<<7) ^ 0x4000 ^ (x = *++pIter);
              if( x>=0x80 ){
                iKey = (iKey<<7) ^ 0x4000 ^ (x = *++pIter);
                if( x>=0x80 ){
                  iKey = (iKey<<8) ^ 0x8000 ^ (*++pIter);
                }
              }
            }
          }
        }
      }else{
        iKey ^= 0x204000;
      }
    }else{
      iKey ^= 0x4000;
    }
  }
  pIter++;

  pInfo->nKey = *(i64*)&iKey;
  pInfo->nPayload = nPayload;
  pInfo->pPayload = pIter;
  testcase( nPayload==pPage->maxLocal );
  testcase( nPayload==(u32)pPage->maxLocal+1 );
  if( nPayload<=pPage->maxLocal ){
    /* This is the (easy) common case where the entire payload fits
    ** on the local page.  No overflow is required.
    */
    pInfo->nSize = nPayload + (u16)(pIter - pCell);
    if( pInfo->nSize<4 ) pInfo->nSize = 4;
    pInfo->nLocal = (u16)nPayload;
  }else{
    btreeParseCellAdjustSizeForOverflow(pPage, pCell, pInfo);
  }
}